

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPackIFWPackage.cxx
# Opt level: O3

void __thiscall cmCPackIFWPackage::GeneratePackageFile(cmCPackIFWPackage *this)

{
  char *pcVar1;
  cmCPackIFWInstaller *pcVar2;
  pointer pcVar3;
  cmCPackIFWGenerator *pcVar4;
  cmCPackLog *this_00;
  _Alloc_hider msg;
  undefined8 uVar5;
  bool bVar6;
  long *plVar7;
  _Rb_tree_node_base *p_Var8;
  long lVar9;
  ostream *poVar10;
  size_t length;
  _func_int **pp_Var11;
  size_type *psVar12;
  string *userInterface;
  pointer pbVar13;
  _Rb_tree_header *p_Var14;
  cmCPackIFWPackage *pcVar15;
  ulong uVar16;
  pointer pbVar17;
  char *__end;
  bool bVar18;
  bool bVar19;
  string path_3;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compAutoDepSet;
  set<cmCPackIFWPackage::DependenceStruct,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  compDepSet;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  cmXMLWriter xout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  licenses;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  translations;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  userInterfaces;
  cmGeneratedFileStream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_558;
  undefined1 local_538 [32];
  _Rb_tree_node_base *local_518;
  size_t local_510;
  cmCPackIFWPackage *local_508;
  undefined1 local_500 [32];
  _Rb_tree_node_base *local_4e0;
  size_t local_4d8;
  undefined1 local_4d0 [40];
  _Alloc_hider local_4a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_498 [3];
  ios_base local_460 [264];
  cmXMLWriter local_358;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2b0;
  undefined1 local_298 [16];
  _func_int *local_288;
  long lStack_280;
  
  if ((this->Directory)._M_string_length == 0) {
    pcVar2 = this->Installer;
    if (pcVar2 == (cmCPackIFWInstaller *)0x0) {
      pcVar4 = (this->super_cmCPackIFWCommon).Generator;
      if (pcVar4 == (cmCPackIFWGenerator *)0x0) goto LAB_0018f8c8;
      local_4d0._0_8_ = local_4d0 + 0x10;
      pcVar3 = (pcVar4->super_cmCPackGenerator).toplevel._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d0,pcVar3,
                 pcVar3 + (pcVar4->super_cmCPackGenerator).toplevel._M_string_length);
      std::__cxx11::string::append((char *)local_4d0);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 (local_4d0,(ulong)(this->Name)._M_dataplus._M_p);
    }
    else {
      local_4d0._0_8_ = local_4d0 + 0x10;
      pcVar3 = (pcVar2->Directory)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_4d0,pcVar3,pcVar3 + (pcVar2->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_4d0);
      plVar7 = (long *)std::__cxx11::string::_M_append
                                 (local_4d0,(ulong)(this->Name)._M_dataplus._M_p);
    }
    pp_Var11 = (_func_int **)(plVar7 + 2);
    if ((_func_int **)*plVar7 == pp_Var11) {
      local_288 = *pp_Var11;
      lStack_280 = plVar7[3];
      local_298._0_8_ = &local_288;
    }
    else {
      local_288 = *pp_Var11;
      local_298._0_8_ = (_func_int **)*plVar7;
    }
    local_298._8_8_ = plVar7[1];
    *plVar7 = (long)pp_Var11;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    std::__cxx11::string::operator=((string *)&this->Directory,(string *)local_298);
    if ((_func_int **)local_298._0_8_ != &local_288) {
      operator_delete((void *)local_298._0_8_,(ulong)(local_288 + 1));
    }
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
LAB_0018f8c8:
  local_4d0._0_8_ = local_4d0 + 0x10;
  pcVar3 = (this->Directory)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_4d0,pcVar3,pcVar3 + (this->Directory)._M_string_length);
  std::__cxx11::string::append((char *)local_4d0);
  cmGeneratedFileStream::cmGeneratedFileStream
            ((cmGeneratedFileStream *)local_298,(string *)local_4d0,false,None);
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  cmXMLWriter::cmXMLWriter(&local_358,(ostream *)local_298,0);
  cmXMLWriter::StartDocument(&local_358,"UTF-8");
  cmCPackIFWCommon::WriteGeneratedByToStrim(&this->super_cmCPackIFWCommon,&local_358);
  local_4d0._0_8_ = local_4d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Package","");
  cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  p_Var8 = (this->DisplayName)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(this->DisplayName)._M_t._M_impl.super__Rb_tree_header;
  local_508 = this;
  if ((_Rb_tree_header *)p_Var8 != p_Var14) {
    do {
      local_4d0._0_8_ = local_4d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"DisplayName","");
      cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      if (p_Var8[1]._M_parent != (_Base_ptr)0x0) {
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_358,"xml:lang",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
      }
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 2));
      cmXMLWriter::EndElement(&local_358);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var14);
  }
  p_Var8 = (local_508->Description)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(local_508->Description)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var14) {
    do {
      local_4d0._0_8_ = local_4d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Description","");
      cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      if (p_Var8[1]._M_parent != (_Base_ptr)0x0) {
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_358,"xml:lang",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 1)
                  );
      }
      cmXMLWriter::Content<std::__cxx11::string>
                (&local_358,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var8 + 2));
      cmXMLWriter::EndElement(&local_358);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var14);
  }
  pcVar15 = local_508;
  if ((local_508->UpdateText)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"UpdateText","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->UpdateText);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  local_4d0._0_8_ = local_4d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Name","");
  cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
  cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Name);
  cmXMLWriter::EndElement(&local_358);
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  local_4d0._0_8_ = local_4d0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Version","");
  cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
  cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Version);
  cmXMLWriter::EndElement(&local_358);
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  if ((pcVar15->ReleaseDate)._M_string_length == 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"ReleaseDate","");
    local_538._0_8_ = local_538 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"%Y-%m-%d","");
    cmTimestamp::CurrentTime((string *)local_500,(cmTimestamp *)&local_558,(string *)local_538,true)
    ;
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>
              (&local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_500);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
      operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
    }
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
  }
  else {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"ReleaseDate","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->ReleaseDate);
    cmXMLWriter::EndElement(&local_358);
  }
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
  if ((pcVar15->Script)._M_string_length != 0) {
    cmsys::SystemTools::GetFilenameName((string *)local_4d0,&pcVar15->Script);
    pcVar1 = local_538 + 0x10;
    pcVar3 = (pcVar15->Directory)._M_dataplus._M_p;
    local_538._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_538,pcVar3,pcVar3 + (pcVar15->Directory)._M_string_length);
    std::__cxx11::string::append(local_538);
    plVar7 = (long *)std::__cxx11::string::_M_append(local_538,local_4d0._0_8_);
    psVar12 = (size_type *)(plVar7 + 2);
    if ((size_type *)*plVar7 == psVar12) {
      local_500._16_8_ = *psVar12;
      local_500._24_8_ = plVar7[3];
      local_500._0_8_ = local_500 + 0x10;
    }
    else {
      local_500._16_8_ = *psVar12;
      local_500._0_8_ = (size_type *)*plVar7;
    }
    local_500._8_8_ = plVar7[1];
    *plVar7 = (long)psVar12;
    plVar7[1] = 0;
    *(undefined1 *)(plVar7 + 2) = 0;
    if ((char *)local_538._0_8_ != pcVar1) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
    cmsys::SystemTools::CopyFileIfDifferent(&pcVar15->Script,(string *)local_500);
    local_538._0_8_ = pcVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"Script","");
    cmXMLWriter::StartElement(&local_358,(string *)local_538);
    cmXMLWriter::Content<std::__cxx11::string>
              (&local_358,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4d0);
    cmXMLWriter::EndElement(&local_358);
    if ((char *)local_538._0_8_ != pcVar1) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
    if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
      operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
    }
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2b0,&pcVar15->UserInterfaces);
  pbVar13 = local_2b0.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2b0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar17 = local_2b0.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::SystemTools::GetFilenameName((string *)local_4d0,pbVar17);
      pcVar3 = (local_508->Directory)._M_dataplus._M_p;
      local_538._0_8_ = local_538 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_538,pcVar3,pcVar3 + (local_508->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_538);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_538,local_4d0._0_8_);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar12) {
        local_500._16_8_ = *psVar12;
        local_500._24_8_ = plVar7[3];
        local_500._0_8_ = local_500 + 0x10;
      }
      else {
        local_500._16_8_ = *psVar12;
        local_500._0_8_ = (size_type *)*plVar7;
      }
      local_500._8_8_ = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent(pbVar17,(string *)local_500);
      std::__cxx11::string::_M_assign((string *)pbVar17);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar13);
    if (local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2b0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_4d0._0_8_ = local_4d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"UserInterfaces","");
      cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      if (local_2b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2b0.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_2b0.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_4d0._0_8_ = local_4d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"UserInterface","");
          cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
          cmXMLWriter::Content<std::__cxx11::string>(&local_358,pbVar13);
          cmXMLWriter::EndElement(&local_358);
          if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
            operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 !=
                 local_2b0.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      cmXMLWriter::EndElement(&local_358);
    }
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2c8,&local_508->Translations);
  pbVar13 = local_2c8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2c8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pbVar17 = local_2c8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      cmsys::SystemTools::GetFilenameName((string *)local_4d0,pbVar17);
      pcVar3 = (local_508->Directory)._M_dataplus._M_p;
      local_538._0_8_ = local_538 + 0x10;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_538,pcVar3,pcVar3 + (local_508->Directory)._M_string_length);
      std::__cxx11::string::append((char *)local_538);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)local_538,local_4d0._0_8_);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar12) {
        local_500._16_8_ = *psVar12;
        local_500._24_8_ = plVar7[3];
        local_500._0_8_ = local_500 + 0x10;
      }
      else {
        local_500._16_8_ = *psVar12;
        local_500._0_8_ = (size_type *)*plVar7;
      }
      local_500._8_8_ = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
        operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent(pbVar17,(string *)local_500);
      std::__cxx11::string::_M_assign((string *)pbVar17);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      pbVar17 = pbVar17 + 1;
    } while (pbVar17 != pbVar13);
    if (local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        local_2c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      local_4d0._0_8_ = local_4d0 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Translations","");
      cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      if (local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_2c8.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        pbVar13 = local_2c8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_4d0._0_8_ = local_4d0 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Translation","");
          cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
          cmXMLWriter::Content<std::__cxx11::string>(&local_358,pbVar13);
          cmXMLWriter::EndElement(&local_358);
          if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
            operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
          }
          pbVar13 = pbVar13 + 1;
        } while (pbVar13 !=
                 local_2c8.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
      cmXMLWriter::EndElement(&local_358);
    }
  }
  pcVar15 = local_508;
  pcVar4 = (local_508->super_cmCPackIFWCommon).Generator;
  if ((pcVar4 == (cmCPackIFWGenerator *)0x0) || ((pcVar4->FrameworkVersion)._M_string_length == 0))
  {
    bVar6 = false;
  }
  else {
    bVar6 = cmCPackIFWCommon::IsVersionLess(&local_508->super_cmCPackIFWCommon,"3.1");
  }
  local_500._24_8_ = local_500 + 8;
  local_500._8_8_ = local_500._8_8_ & 0xffffffff00000000;
  local_500._16_8_ = 0;
  local_4d8 = 0;
  p_Var8 = (pcVar15->AlienDependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(pcVar15->AlienDependencies)._M_t._M_impl.super__Rb_tree_header;
  local_4e0 = (_Rb_tree_node_base *)local_500._24_8_;
  if ((_Rb_tree_header *)p_Var8 != p_Var14) {
    do {
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                  *)local_500,*(DependenceStruct **)(p_Var8 + 1));
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var14);
  }
  p_Var8 = (pcVar15->Dependencies)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(pcVar15->Dependencies)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)p_Var8 != p_Var14) {
    do {
      DependenceStruct::DependenceStruct
                ((DependenceStruct *)local_4d0,(string *)(*(long *)(p_Var8 + 1) + 0xa8));
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
                  *)local_500,(DependenceStruct *)local_4d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4a8._M_p != local_498) {
        operator_delete(local_4a8._M_p,local_498[0]._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var14);
  }
  if (local_4d8 == 0) {
    bVar18 = false;
    pcVar15 = local_508;
  }
  else {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    uVar5 = local_500._24_8_;
    if (bVar6 == false) {
      bVar18 = false;
    }
    else {
      lVar9 = std::__cxx11::string::find((char)local_500._24_8_ + ' ',0x2d);
      bVar18 = lVar9 != -1;
    }
    DependenceStruct::NameWithCompare_abi_cxx11_
              ((string *)local_538,(DependenceStruct *)(uVar5 + 0x20));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4d0,(char *)local_538._0_8_,
               CONCAT44(local_538._12_4_,local_538._8_4_));
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
    p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar5);
    if (p_Var8 != (_Rb_tree_node_base *)(local_500 + 8)) {
      do {
        if (bVar6 == false) {
          bVar19 = false;
        }
        else {
          lVar9 = std::__cxx11::string::find((char)p_Var8 + ' ',0x2d);
          bVar19 = lVar9 != -1;
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,",",1);
        DependenceStruct::NameWithCompare_abi_cxx11_
                  ((string *)local_538,(DependenceStruct *)(p_Var8 + 1));
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_4d0,(char *)local_538._0_8_,
                   CONCAT44(local_538._12_4_,local_538._8_4_));
        if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
          operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
        }
        bVar18 = (bool)(bVar18 | bVar19);
        p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
      } while (p_Var8 != (_Rb_tree_node_base *)(local_500 + 8));
    }
    local_538._0_8_ = local_538 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_538,"Dependencies","");
    std::__cxx11::stringbuf::str();
    pcVar15 = local_508;
    cmXMLWriter::StartElement(&local_358,(string *)local_538);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&local_558);
    cmXMLWriter::EndElement(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    if ((undefined1 *)local_538._0_8_ != local_538 + 0x10) {
      operator_delete((void *)local_538._0_8_,local_538._16_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::ios_base::~ios_base(local_460);
  }
  local_538._24_8_ = local_538 + 8;
  local_538._8_4_ = _S_red;
  local_538._16_8_ = 0;
  local_510 = 0;
  p_Var8 = (pcVar15->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  p_Var14 = &(pcVar15->AlienAutoDependOn)._M_t._M_impl.super__Rb_tree_header;
  local_518 = (_Rb_tree_node_base *)local_538._24_8_;
  if ((_Rb_tree_header *)p_Var8 != p_Var14) {
    do {
      std::
      _Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
      ::_M_insert_unique<cmCPackIFWPackage::DependenceStruct_const&>
                ((_Rb_tree<cmCPackIFWPackage::DependenceStruct,cmCPackIFWPackage::DependenceStruct,std::_Identity<cmCPackIFWPackage::DependenceStruct>,std::less<cmCPackIFWPackage::DependenceStruct>,std::allocator<cmCPackIFWPackage::DependenceStruct>>
                  *)local_538,*(DependenceStruct **)(p_Var8 + 1));
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
    } while ((_Rb_tree_header *)p_Var8 != p_Var14);
    if (local_510 != 0) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
      uVar5 = local_538._24_8_;
      if (bVar6 == false) {
        bVar19 = false;
      }
      else {
        lVar9 = std::__cxx11::string::find((char)local_538._24_8_ + ' ',0x2d);
        bVar19 = lVar9 != -1;
      }
      DependenceStruct::NameWithCompare_abi_cxx11_(&local_558,(DependenceStruct *)(uVar5 + 0x20));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d0,local_558._M_dataplus._M_p,local_558._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      bVar18 = (bool)(bVar18 | bVar19);
      p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment((_Rb_tree_node_base *)uVar5);
      if (p_Var8 != (_Rb_tree_node_base *)(local_538 + 8)) {
        do {
          if (bVar6 == false) {
            bVar19 = false;
          }
          else {
            lVar9 = std::__cxx11::string::find((char)p_Var8 + ' ',0x2d);
            bVar19 = lVar9 != -1;
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,",",1);
          DependenceStruct::NameWithCompare_abi_cxx11_(&local_558,(DependenceStruct *)(p_Var8 + 1));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_4d0,local_558._M_dataplus._M_p,local_558._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_558._M_dataplus._M_p != &local_558.field_2) {
            operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
          }
          bVar18 = (bool)(bVar18 | bVar19);
          p_Var8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var8);
        } while (p_Var8 != (_Rb_tree_node_base *)(local_538 + 8));
      }
      local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"AutoDependOn","");
      std::__cxx11::stringbuf::str();
      pcVar15 = local_508;
      cmXMLWriter::StartElement(&local_358,&local_558);
      cmXMLWriter::Content<std::__cxx11::string>(&local_358,&local_300);
      cmXMLWriter::EndElement(&local_358);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
      std::ios_base::~ios_base(local_460);
    }
  }
  if (bVar18) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4d0,"The dependencies for component \"",0x20);
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_4d0,(pcVar15->Name)._M_dataplus._M_p,
                         (pcVar15->Name)._M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"\" specify names that contain hyphens. ",0x26);
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar10,"This requires QtIFW 3.1 or later, but you are using version ",0x3c);
    pcVar4 = (pcVar15->super_cmCPackIFWCommon).Generator;
    poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(pcVar4->FrameworkVersion)._M_dataplus._M_p,
                         (pcVar4->FrameworkVersion)._M_string_length);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
    pcVar4 = (pcVar15->super_cmCPackIFWCommon).Generator;
    if (pcVar4 != (cmCPackIFWGenerator *)0x0) {
      this_00 = (pcVar4->super_cmCPackGenerator).Logger;
      std::__cxx11::stringbuf::str();
      msg._M_p = local_558._M_dataplus._M_p;
      length = strlen(local_558._M_dataplus._M_p);
      cmCPackLog::Log(this_00,8,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/CPack/IFW/cmCPackIFWPackage.cxx"
                      ,0x2b4,msg._M_p,length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::ios_base::~ios_base(local_460);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0,&pcVar15->Licenses);
  if (0x20 < (ulong)((long)local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                    (long)local_2e0.
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)) {
    uVar16 = 1;
    lVar9 = 0x20;
    do {
      cmsys::SystemTools::GetFilenameName
                ((string *)local_4d0,
                 (string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9));
      pcVar3 = (local_508->Directory)._M_dataplus._M_p;
      local_300._M_dataplus._M_p = (pointer)&local_300.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_300,pcVar3,pcVar3 + (local_508->Directory)._M_string_length);
      std::__cxx11::string::append((char *)&local_300);
      plVar7 = (long *)std::__cxx11::string::_M_append((char *)&local_300,local_4d0._0_8_);
      psVar12 = (size_type *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar12) {
        local_558.field_2._M_allocated_capacity = *psVar12;
        local_558.field_2._8_8_ = plVar7[3];
        local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
      }
      else {
        local_558.field_2._M_allocated_capacity = *psVar12;
        local_558._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_558._M_string_length = plVar7[1];
      *plVar7 = (long)psVar12;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_300._M_dataplus._M_p != &local_300.field_2) {
        operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
      }
      cmsys::SystemTools::CopyFileIfDifferent
                ((string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9),
                 &local_558);
      std::__cxx11::string::_M_assign
                ((string *)
                 ((long)&((local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9));
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_558._M_dataplus._M_p != &local_558.field_2) {
        operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
      }
      if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
        operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
      }
      uVar16 = uVar16 + 2;
      lVar9 = lVar9 + 0x40;
    } while (uVar16 < (ulong)((long)local_2e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_2e0.
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 5));
  }
  if (local_2e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_2e0.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Licenses","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
    if (local_2e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_2e0.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      lVar9 = 0x20;
      uVar16 = 0;
      do {
        local_4d0._0_8_ = local_4d0 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"License","");
        cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
        if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
          operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
        }
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_358,"name",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&local_2e0.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start[-1]._M_dataplus._M_p + lVar9));
        cmXMLWriter::Attribute<std::__cxx11::string>
                  (&local_358,"file",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&((local_2e0.
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p + lVar9))
        ;
        cmXMLWriter::EndElement(&local_358);
        uVar16 = uVar16 + 2;
        lVar9 = lVar9 + 0x40;
      } while (uVar16 < (ulong)((long)local_2e0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)local_2e0.
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 5));
    }
    cmXMLWriter::EndElement(&local_358);
  }
  pcVar15 = local_508;
  if ((local_508->ForcedInstallation)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"ForcedInstallation","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->ForcedInstallation);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  if ((pcVar15->Replaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (pcVar15->Replaces).
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_4d0);
    pbVar13 = (pcVar15->Replaces).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_4d0,(pbVar13->_M_dataplus)._M_p,pbVar13->_M_string_length);
    while (pbVar17 = pbVar13 + 1,
          pbVar17 !=
          (pcVar15->Replaces).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_4d0,",",1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_4d0,(pbVar17->_M_dataplus)._M_p,pbVar13[1]._M_string_length);
      pbVar13 = pbVar17;
    }
    local_558._M_dataplus._M_p = (pointer)&local_558.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_558,"Replaces","");
    std::__cxx11::stringbuf::str();
    cmXMLWriter::StartElement(&local_358,&local_558);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&local_300);
    cmXMLWriter::EndElement(&local_358);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_300._M_dataplus._M_p != &local_300.field_2) {
      operator_delete(local_300._M_dataplus._M_p,local_300.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_558._M_dataplus._M_p != &local_558.field_2) {
      operator_delete(local_558._M_dataplus._M_p,local_558.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_4d0);
    std::ios_base::~ios_base(local_460);
  }
  if ((pcVar15->RequiresAdminRights)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"RequiresAdminRights","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->RequiresAdminRights);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  if ((pcVar15->Virtual)._M_string_length == 0) {
    if ((pcVar15->Default)._M_string_length == 0) goto LAB_00191208;
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Default","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Default);
    cmXMLWriter::EndElement(&local_358);
  }
  else {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Virtual","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Virtual);
    cmXMLWriter::EndElement(&local_358);
  }
  if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
    operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
  }
LAB_00191208:
  if ((pcVar15->Essential)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Essential","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Essential);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  if ((pcVar15->SortingPriority)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"SortingPriority","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->SortingPriority);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  if ((pcVar15->Checkable)._M_string_length != 0) {
    local_4d0._0_8_ = local_4d0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_4d0,"Checkable","");
    cmXMLWriter::StartElement(&local_358,(string *)local_4d0);
    cmXMLWriter::Content<std::__cxx11::string>(&local_358,&pcVar15->Checkable);
    cmXMLWriter::EndElement(&local_358);
    if ((undefined1 *)local_4d0._0_8_ != local_4d0 + 0x10) {
      operator_delete((void *)local_4d0._0_8_,local_4d0._16_8_ + 1);
    }
  }
  cmXMLWriter::EndElement(&local_358);
  cmXMLWriter::EndDocument(&local_358);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
               *)local_538);
  std::
  _Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
  ::~_Rb_tree((_Rb_tree<cmCPackIFWPackage::DependenceStruct,_cmCPackIFWPackage::DependenceStruct,_std::_Identity<cmCPackIFWPackage::DependenceStruct>,_std::less<cmCPackIFWPackage::DependenceStruct>,_std::allocator<cmCPackIFWPackage::DependenceStruct>_>
               *)local_500);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2b0);
  cmXMLWriter::~cmXMLWriter(&local_358);
  cmGeneratedFileStream::~cmGeneratedFileStream((cmGeneratedFileStream *)local_298);
  return;
}

Assistant:

void cmCPackIFWPackage::GeneratePackageFile()
{
  // Lazy directory initialization
  if (this->Directory.empty()) {
    if (this->Installer) {
      this->Directory = this->Installer->Directory + "/packages/" + this->Name;
    } else if (this->Generator) {
      this->Directory = this->Generator->toplevel + "/packages/" + this->Name;
    }
  }

  // Output stream
  cmGeneratedFileStream fout(this->Directory + "/meta/package.xml");
  cmXMLWriter xout(fout);

  xout.StartDocument();

  this->WriteGeneratedByToStrim(xout);

  xout.StartElement("Package");

  // DisplayName (with translations)
  for (auto const& dn : this->DisplayName) {
    xout.StartElement("DisplayName");
    if (!dn.first.empty()) {
      xout.Attribute("xml:lang", dn.first);
    }
    xout.Content(dn.second);
    xout.EndElement();
  }

  // Description (with translations)
  for (auto const& d : this->Description) {
    xout.StartElement("Description");
    if (!d.first.empty()) {
      xout.Attribute("xml:lang", d.first);
    }
    xout.Content(d.second);
    xout.EndElement();
  }

  // Update text
  if (!this->UpdateText.empty()) {
    xout.Element("UpdateText", this->UpdateText);
  }

  xout.Element("Name", this->Name);
  xout.Element("Version", this->Version);

  if (!this->ReleaseDate.empty()) {
    xout.Element("ReleaseDate", this->ReleaseDate);
  } else {
    xout.Element("ReleaseDate", cmTimestamp().CurrentTime("%Y-%m-%d", true));
  }

  // Script (copy to meta dir)
  if (!this->Script.empty()) {
    std::string name = cmSystemTools::GetFilenameName(this->Script);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(this->Script, path);
    xout.Element("Script", name);
  }

  // User Interfaces (copy to meta dir)
  std::vector<std::string> userInterfaces = this->UserInterfaces;
  for (std::string& userInterface : userInterfaces) {
    std::string name = cmSystemTools::GetFilenameName(userInterface);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(userInterface, path);
    userInterface = name;
  }
  if (!userInterfaces.empty()) {
    xout.StartElement("UserInterfaces");
    for (std::string const& userInterface : userInterfaces) {
      xout.Element("UserInterface", userInterface);
    }
    xout.EndElement();
  }

  // Translations (copy to meta dir)
  std::vector<std::string> translations = this->Translations;
  for (std::string& translation : translations) {
    std::string name = cmSystemTools::GetFilenameName(translation);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(translation, path);
    translation = name;
  }
  if (!translations.empty()) {
    xout.StartElement("Translations");
    for (std::string const& translation : translations) {
      xout.Element("Translation", translation);
    }
    xout.EndElement();
  }

  // Dependencies
  const bool hyphensInNamesUnsupported = this->Generator &&
    !this->Generator->FrameworkVersion.empty() && this->IsVersionLess("3.1");
  bool warnUnsupportedNames = false;
  std::set<DependenceStruct> compDepSet;
  for (DependenceStruct* ad : this->AlienDependencies) {
    compDepSet.insert(*ad);
  }
  for (cmCPackIFWPackage* d : this->Dependencies) {
    compDepSet.insert(DependenceStruct(d->Name));
  }
  // Write dependencies
  if (!compDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("Dependencies", dependencies.str());
  }

  // Automatic dependency on
  std::set<DependenceStruct> compAutoDepSet;
  for (DependenceStruct* aad : this->AlienAutoDependOn) {
    compAutoDepSet.insert(*aad);
  }
  // Write automatic dependency on
  if (!compAutoDepSet.empty()) {
    std::ostringstream dependencies;
    auto it = compAutoDepSet.begin();
    warnUnsupportedNames |=
      hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
    dependencies << it->NameWithCompare();
    ++it;
    while (it != compAutoDepSet.end()) {
      warnUnsupportedNames |=
        hyphensInNamesUnsupported && it->Name.find('-') != std::string::npos;
      dependencies << "," << it->NameWithCompare();
      ++it;
    }
    xout.Element("AutoDependOn", dependencies.str());
  }

  if (warnUnsupportedNames) {
    cmCPackIFWLogger(
      WARNING,
      "The dependencies for component \""
        << this->Name << "\" specify names that contain hyphens. "
        << "This requires QtIFW 3.1 or later, but you are using version "
        << this->Generator->FrameworkVersion << std::endl);
  }

  // Licenses (copy to meta dir)
  std::vector<std::string> licenses = this->Licenses;
  for (size_t i = 1; i < licenses.size(); i += 2) {
    std::string name = cmSystemTools::GetFilenameName(licenses[i]);
    std::string path = this->Directory + "/meta/" + name;
    cmsys::SystemTools::CopyFileIfDifferent(licenses[i], path);
    licenses[i] = name;
  }
  if (!licenses.empty()) {
    xout.StartElement("Licenses");
    for (size_t i = 0; i < licenses.size(); i += 2) {
      xout.StartElement("License");
      xout.Attribute("name", licenses[i]);
      xout.Attribute("file", licenses[i + 1]);
      xout.EndElement();
    }
    xout.EndElement();
  }

  if (!this->ForcedInstallation.empty()) {
    xout.Element("ForcedInstallation", this->ForcedInstallation);
  }

  // Replaces
  if (!this->Replaces.empty()) {
    std::ostringstream replaces;
    auto it = this->Replaces.begin();
    replaces << *it;
    ++it;
    while (it != this->Replaces.end()) {
      replaces << "," << *it;
      ++it;
    }
    xout.Element("Replaces", replaces.str());
  }

  if (!this->RequiresAdminRights.empty()) {
    xout.Element("RequiresAdminRights", this->RequiresAdminRights);
  }

  if (!this->Virtual.empty()) {
    xout.Element("Virtual", this->Virtual);
  } else if (!this->Default.empty()) {
    xout.Element("Default", this->Default);
  }

  // Essential
  if (!this->Essential.empty()) {
    xout.Element("Essential", this->Essential);
  }

  // Priority
  if (!this->SortingPriority.empty()) {
    xout.Element("SortingPriority", this->SortingPriority);
  }

  // Checkable
  if (!this->Checkable.empty()) {
    xout.Element("Checkable", this->Checkable);
  }

  xout.EndElement();
  xout.EndDocument();
}